

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

int __thiscall cmake::CheckBuildSystem(cmake *this)

{
  _Hash_node_base *p_Var1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  cmMakefile *pcVar6;
  ostream *poVar7;
  size_t sVar8;
  cmGlobalGenerator *globalGenerator;
  undefined4 extraout_var;
  char *__s;
  uint uVar10;
  string *name;
  _Base_ptr p_Var11;
  pointer pbVar12;
  bool bVar13;
  bool bVar14;
  int result_1;
  string dep_newest;
  auto_ptr<cmMakefile> mf;
  string out_oldest;
  int result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  products;
  ostringstream msg_2;
  cmake cm;
  cmGlobalGenerator gg;
  int local_a64;
  auto_ptr<cmMakefile> local_a60;
  long local_a58;
  undefined1 local_a50 [24];
  _Rb_tree_node_base *local_a38;
  _Base_ptr local_a30;
  _Rb_tree_node_base local_a28;
  size_type local_a08 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9b8;
  undefined1 local_998 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_988 [6];
  ios_base local_928 [272];
  undefined1 local_818 [664];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_580;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_578;
  _Base_ptr local_570;
  undefined1 local_568 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558 [6];
  ios_base local_4f8 [1224];
  long *plVar9;
  
  pcVar5 = cmsys::SystemTools::GetEnv("VERBOSE");
  if (pcVar5 == (char *)0x0) {
    bVar13 = false;
  }
  else {
    pcVar5 = cmsys::SystemTools::GetEnv("CMAKE_NO_VERBOSE");
    bVar13 = pcVar5 == (char *)0x0;
  }
  if ((this->CheckBuildSystemArgument)._M_string_length == 0) {
    if (bVar13 == false) {
      return 1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_568);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_568,"Re-run cmake no build system arguments\n",0x27);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout((char *)local_818._0_8_);
LAB_0029b401:
    if ((cmState *)local_818._0_8_ != (cmState *)(local_818 + 0x10)) {
      operator_delete((void *)local_818._0_8_,local_818._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_568);
    std::ios_base::~ios_base(local_4f8);
    return 1;
  }
  bVar3 = cmsys::SystemTools::FileExists((this->CheckBuildSystemArgument)._M_dataplus._M_p);
  if (!bVar3) {
    if (bVar13 == false) {
      return 1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_568);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_568,"Re-run cmake missing file: ",0x1b);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_568,(this->CheckBuildSystemArgument)._M_dataplus._M_p,
                        (this->CheckBuildSystemArgument)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout((char *)local_818._0_8_);
    goto LAB_0029b401;
  }
  cmake((cmake *)local_818);
  local_568._0_8_ = local_558;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_568,"");
  SetHomeDirectory((cmake *)local_818,(string *)local_568);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._0_8_ != local_558) {
    operator_delete((void *)local_568._0_8_,local_558[0]._M_allocated_capacity + 1);
  }
  local_568._0_8_ = local_558;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_568,"");
  SetHomeOutputDirectory((cmake *)local_818,(string *)local_568);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._0_8_ != local_558) {
    operator_delete((void *)local_568._0_8_,local_558[0]._M_allocated_capacity + 1);
  }
  local_558[0]._M_allocated_capacity = local_570;
  local_568._0_8_ = local_580;
  local_568._8_8_ = pcStack_578;
  cmState::Snapshot::SetDefaultDefinitions((Snapshot *)local_568);
  cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)local_568,(cmake *)local_818);
  pcVar6 = (cmMakefile *)operator_new(0x730);
  local_988[0]._M_allocated_capacity = local_570;
  local_998._0_8_ = local_580;
  local_998._8_8_ = pcStack_578;
  cmMakefile::cmMakefile(pcVar6,(cmGlobalGenerator *)local_568,(Snapshot *)local_998);
  local_a50._16_8_ = pcVar6;
  bVar3 = cmMakefile::ReadListFile(pcVar6,(this->CheckBuildSystemArgument)._M_dataplus._M_p);
  if ((((!bVar3) || (cmSystemTools::s_ErrorOccured != false)) ||
      (cmSystemTools::s_FatalErrorOccured != false)) ||
     (bVar3 = cmSystemTools::GetInterruptFlag(), uVar2 = local_a50._16_8_, bVar3)) {
    uVar10 = 1;
    if (bVar13 != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_998);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_998,"Re-run cmake error reading : ",0x1d);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_998,(this->CheckBuildSystemArgument)._M_dataplus._M_p,
                          (this->CheckBuildSystemArgument)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout((char *)local_a60.x_);
      if (local_a60.x_ != (cmMakefile *)local_a50) {
        operator_delete(local_a60.x_,local_a50._0_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_998);
      std::ios_base::~ios_base(local_928);
    }
    goto LAB_0029b2fc;
  }
  if (this->ClearBuildSystem == true) {
    local_998._0_8_ = local_988;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_998,"CMAKE_DEPENDS_GENERATOR","");
    pcVar5 = cmMakefile::GetDefinition((cmMakefile *)uVar2,(string *)local_998);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_998._0_8_ != local_988) {
      operator_delete((void *)local_998._0_8_,(ulong)(local_988[0]._M_allocated_capacity + 1));
    }
    if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
      pcVar5 = "Unix Makefiles";
    }
    local_998._0_8_ = local_988;
    sVar8 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_998,pcVar5,pcVar5 + sVar8);
    globalGenerator = CreateGlobalGenerator(this,(string *)local_998);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_998._0_8_ != local_988) {
      operator_delete((void *)local_998._0_8_,(ulong)(local_988[0]._M_allocated_capacity + 1));
    }
    if (globalGenerator != (cmGlobalGenerator *)0x0) {
      local_988[0]._M_allocated_capacity = local_570;
      local_998._0_8_ = local_580;
      local_998._8_8_ = pcStack_578;
      cmState::Snapshot::SetDefaultDefinitions((Snapshot *)local_998);
      pcVar6 = (cmMakefile *)operator_new(0x730);
      local_988[0]._M_allocated_capacity = local_570;
      local_998._0_8_ = local_580;
      local_998._8_8_ = pcStack_578;
      cmMakefile::cmMakefile(pcVar6,globalGenerator,(Snapshot *)local_998);
      local_a60.x_ = pcVar6;
      iVar4 = (*globalGenerator->_vptr_cmGlobalGenerator[2])(globalGenerator,pcVar6);
      plVar9 = (long *)CONCAT44(extraout_var,iVar4);
      (**(code **)(*plVar9 + 0x48))(plVar9,local_a60.x_,bVar13);
      (**(code **)(*plVar9 + 8))(plVar9);
      cmsys::auto_ptr<cmMakefile>::~auto_ptr(&local_a60);
      if (globalGenerator != (cmGlobalGenerator *)0x0) {
        (*globalGenerator->_vptr_cmGlobalGenerator[1])(globalGenerator);
      }
    }
  }
  uVar2 = local_a50._16_8_;
  local_9b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_9b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_9b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_998._0_8_ = local_988;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_998,"CMAKE_MAKEFILE_PRODUCTS","");
  pcVar5 = cmMakefile::GetDefinition((cmMakefile *)uVar2,(string *)local_998);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998._0_8_ != local_988) {
    operator_delete((void *)local_998._0_8_,(ulong)(local_988[0]._M_allocated_capacity + 1));
  }
  name = local_9b8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if (pcVar5 != (char *)0x0) {
    local_998._0_8_ = local_988;
    sVar8 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_998,pcVar5,pcVar5 + sVar8);
    cmSystemTools::ExpandListArgument((string *)local_998,&local_9b8,false);
    name = local_9b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_998._0_8_ != local_988) {
      operator_delete((void *)local_998._0_8_,(ulong)(local_988[0]._M_allocated_capacity + 1));
      name = local_9b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  for (; uVar2 = local_a50._16_8_,
      name != local_9b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; name = name + 1) {
    bVar3 = cmsys::SystemTools::FileExists((name->_M_dataplus)._M_p);
    if ((!bVar3) && (bVar3 = cmsys::SystemTools::FileIsSymlink(name), !bVar3)) {
      uVar10 = 1;
      if (bVar13 != false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_998);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_998,"Re-run cmake, missing byproduct: ",0x21);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_998,(name->_M_dataplus)._M_p,name->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__cxx11::stringbuf::str();
        cmSystemTools::Stdout((char *)local_a60.x_);
        if (local_a60.x_ != (cmMakefile *)local_a50) {
          operator_delete(local_a60.x_,local_a50._0_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_998);
        std::ios_base::~ios_base(local_928);
      }
      goto LAB_0029bd2f;
    }
  }
  local_9d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_9f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_9f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_998._0_8_ = local_988;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_998,"CMAKE_MAKEFILE_DEPENDS","");
  pcVar5 = cmMakefile::GetDefinition((cmMakefile *)uVar2,(string *)local_998);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998._0_8_ != local_988) {
    operator_delete((void *)local_998._0_8_,(ulong)(local_988[0]._M_allocated_capacity + 1));
  }
  uVar2 = local_a50._16_8_;
  local_998._0_8_ = local_988;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_998,"CMAKE_MAKEFILE_OUTPUTS","");
  __s = cmMakefile::GetDefinition((cmMakefile *)uVar2,(string *)local_998);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998._0_8_ != local_988) {
    operator_delete((void *)local_998._0_8_,(ulong)(local_988[0]._M_allocated_capacity + 1));
  }
  if (__s != (char *)0x0 && pcVar5 != (char *)0x0) {
    local_998._0_8_ = local_988;
    sVar8 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_998,pcVar5,pcVar5 + sVar8);
    cmSystemTools::ExpandListArgument((string *)local_998,&local_9d8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_998._0_8_ != local_988) {
      operator_delete((void *)local_998._0_8_,(ulong)(local_988[0]._M_allocated_capacity + 1));
    }
    local_998._0_8_ = local_988;
    sVar8 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_998,__s,__s + sVar8);
    cmSystemTools::ExpandListArgument((string *)local_998,&local_9f8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_998._0_8_ != local_988) {
      operator_delete((void *)local_998._0_8_,(ulong)(local_988[0]._M_allocated_capacity + 1));
    }
  }
  p_Var11 = (_Base_ptr)
            local_9d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((local_9d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_9d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (local_9f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_9f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    local_a60.x_ = (cmMakefile *)local_a50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a60,
               *(long *)local_9d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
               (long)&((_Base_ptr)
                      (local_9d8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length)->_M_color +
               *(long *)local_9d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    do {
      pbVar12 = local_9f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var11 = p_Var11 + 1;
      if (p_Var11 ==
          (_Base_ptr)
          local_9d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_a38 = &local_a28;
        p_Var1 = (_Hash_node_base *)
                 ((local_9f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a38,p_Var1,
                   (long)&p_Var1->_M_nxt +
                   (local_9f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        goto LAB_0029baf6;
      }
      local_a28._M_left._0_4_ = 0;
      bVar3 = cmFileTimeComparison::FileTimeCompare
                        (this->FileComparison,(char *)local_a60.x_,*(char **)p_Var11,
                         (int *)&local_a28._M_left);
      if (bVar3) {
        if ((int)local_a28._M_left < 0) {
          std::__cxx11::string::_M_assign((string *)&local_a60);
        }
      }
      else if (bVar13 != false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_998);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_998,"Re-run cmake: build system dependency is missing\n",0x31);
        std::__cxx11::stringbuf::str();
        cmSystemTools::Stdout((char *)local_a38);
        if (local_a38 != &local_a28) {
          operator_delete(local_a38,local_a28._0_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_998);
        std::ios_base::~ios_base(local_928);
      }
    } while (bVar3);
    uVar10 = 1;
    goto LAB_0029bd01;
  }
  uVar10 = 1;
  if (bVar13 != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_998);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_998,
               "Re-run cmake no CMAKE_MAKEFILE_DEPENDS or CMAKE_MAKEFILE_OUTPUTS :\n",0x43);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout((char *)local_a60.x_);
    if (local_a60.x_ != (cmMakefile *)local_a50) {
      operator_delete(local_a60.x_,local_a50._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_998);
    std::ios_base::~ios_base(local_928);
  }
  goto LAB_0029bd18;
  while( true ) {
    local_a64 = 0;
    bVar3 = cmFileTimeComparison::FileTimeCompare
                      (this->FileComparison,(char *)local_a38,(char *)(pbVar12->_M_dataplus)._M_p,
                       &local_a64);
    if (bVar3) {
      if (0 < local_a64) {
        std::__cxx11::string::_M_assign((string *)&local_a38);
      }
    }
    else if (bVar13 != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_998);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_998,"Re-run cmake: build system output is missing\n",0x2d);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout((char *)CONCAT44(local_a28._M_left._4_4_,(int)local_a28._M_left));
      if ((size_type *)CONCAT44(local_a28._M_left._4_4_,(int)local_a28._M_left) != local_a08) {
        operator_delete((size_type *)CONCAT44(local_a28._M_left._4_4_,(int)local_a28._M_left),
                        local_a08[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_998);
      std::ios_base::~ios_base(local_928);
    }
    if (!bVar3) break;
LAB_0029baf6:
    pbVar12 = pbVar12 + 1;
    if (pbVar12 ==
        local_9f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_a64 = 0;
      bVar3 = cmFileTimeComparison::FileTimeCompare
                        (this->FileComparison,(char *)local_a38,(char *)local_a60.x_,&local_a64);
      bVar14 = local_a64 < 0;
      if (bVar13 == true && (!bVar3 || bVar14)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_998);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_998,"Re-run cmake file: ",0x13);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_998,(char *)local_a38,(long)local_a30);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," older than: ",0xd);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_a60.x_,local_a58);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__cxx11::stringbuf::str();
        cmSystemTools::Stdout((char *)CONCAT44(local_a28._M_left._4_4_,(int)local_a28._M_left));
        if ((size_type *)CONCAT44(local_a28._M_left._4_4_,(int)local_a28._M_left) != local_a08) {
          operator_delete((size_type *)CONCAT44(local_a28._M_left._4_4_,(int)local_a28._M_left),
                          local_a08[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_998);
        std::ios_base::~ios_base(local_928);
      }
      uVar10 = (uint)(!bVar3 || bVar14);
      goto LAB_0029bce0;
    }
  }
  uVar10 = 1;
LAB_0029bce0:
  if (local_a38 != &local_a28) {
    operator_delete(local_a38,local_a28._0_8_ + 1);
  }
LAB_0029bd01:
  if (local_a60.x_ != (cmMakefile *)local_a50) {
    operator_delete(local_a60.x_,local_a50._0_8_ + 1);
  }
LAB_0029bd18:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_9f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_9d8);
LAB_0029bd2f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_9b8);
LAB_0029b2fc:
  cmsys::auto_ptr<cmMakefile>::~auto_ptr((auto_ptr<cmMakefile> *)(local_a50 + 0x10));
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)local_568);
  ~cmake((cmake *)local_818);
  return uVar10;
}

Assistant:

int cmake::CheckBuildSystem()
{
  // We do not need to rerun CMake.  Check dependency integrity.  Use
  // the make system's VERBOSE environment variable to enable verbose
  // output. This can be skipped by setting CMAKE_NO_VERBOSE (which is set
  // by the Eclipse and KDevelop generators).
  bool verbose = ((cmSystemTools::GetEnv("VERBOSE") != 0)
                   && (cmSystemTools::GetEnv("CMAKE_NO_VERBOSE") == 0));

  // This method will check the integrity of the build system if the
  // option was given on the command line.  It reads the given file to
  // determine whether CMake should rerun.

  // If no file is provided for the check, we have to rerun.
  if(this->CheckBuildSystemArgument.empty())
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake no build system arguments\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // If the file provided does not exist, we have to rerun.
  if(!cmSystemTools::FileExists(this->CheckBuildSystemArgument.c_str()))
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake missing file: "
          << this->CheckBuildSystemArgument << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // Read the rerun check file and use it to decide whether to do the
  // global generate.
  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmsys::auto_ptr<cmMakefile> mf(new cmMakefile(&gg, cm.GetCurrentSnapshot()));
  if(!mf->ReadListFile(this->CheckBuildSystemArgument.c_str()) ||
     cmSystemTools::GetErrorOccuredFlag())
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake error reading : "
          << this->CheckBuildSystemArgument << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    // There was an error reading the file.  Just rerun.
    return 1;
    }

  if(this->ClearBuildSystem)
    {
    // Get the generator used for this build system.
    const char* genName = mf->GetDefinition("CMAKE_DEPENDS_GENERATOR");
    if(!genName || genName[0] == '\0')
      {
      genName = "Unix Makefiles";
      }

    // Create the generator and use it to clear the dependencies.
    cmsys::auto_ptr<cmGlobalGenerator>
      ggd(this->CreateGlobalGenerator(genName));
    if(ggd.get())
      {
      cm.GetCurrentSnapshot().SetDefaultDefinitions();
      cmsys::auto_ptr<cmMakefile> mfd(new cmMakefile(ggd.get(),
                                                    cm.GetCurrentSnapshot()));
      cmsys::auto_ptr<cmLocalGenerator> lgd(
            ggd->CreateLocalGenerator(mfd.get()));
      lgd->ClearDependencies(mfd.get(), verbose);
      }
    }

  // If any byproduct of makefile generation is missing we must re-run.
  std::vector<std::string> products;
  if(const char* productStr = mf->GetDefinition("CMAKE_MAKEFILE_PRODUCTS"))
    {
    cmSystemTools::ExpandListArgument(productStr, products);
    }
  for(std::vector<std::string>::const_iterator pi = products.begin();
      pi != products.end(); ++pi)
    {
    if(!(cmSystemTools::FileExists(pi->c_str()) ||
         cmSystemTools::FileIsSymlink(*pi)))
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake, missing byproduct: " << *pi << "\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // Get the set of dependencies and outputs.
  std::vector<std::string> depends;
  std::vector<std::string> outputs;
  const char* dependsStr = mf->GetDefinition("CMAKE_MAKEFILE_DEPENDS");
  const char* outputsStr = mf->GetDefinition("CMAKE_MAKEFILE_OUTPUTS");
  if(dependsStr && outputsStr)
    {
    cmSystemTools::ExpandListArgument(dependsStr, depends);
    cmSystemTools::ExpandListArgument(outputsStr, outputs);
    }
  if(depends.empty() || outputs.empty())
    {
    // Not enough information was provided to do the test.  Just rerun.
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake no CMAKE_MAKEFILE_DEPENDS "
        "or CMAKE_MAKEFILE_OUTPUTS :\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // Find the newest dependency.
  std::vector<std::string>::iterator dep = depends.begin();
  std::string dep_newest = *dep++;
  for(;dep != depends.end(); ++dep)
    {
    int result = 0;
    if(this->FileComparison->FileTimeCompare(dep_newest.c_str(),
                                             dep->c_str(), &result))
      {
      if(result < 0)
        {
        dep_newest = *dep;
        }
      }
    else
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake: build system dependency is missing\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // Find the oldest output.
  std::vector<std::string>::iterator out = outputs.begin();
  std::string out_oldest = *out++;
  for(;out != outputs.end(); ++out)
    {
    int result = 0;
    if(this->FileComparison->FileTimeCompare(out_oldest.c_str(),
                                             out->c_str(), &result))
      {
      if(result > 0)
        {
        out_oldest = *out;
        }
      }
    else
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake: build system output is missing\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // If any output is older than any dependency then rerun.
  {
  int result = 0;
  if(!this->FileComparison->FileTimeCompare(out_oldest.c_str(),
                                            dep_newest.c_str(),
                                            &result) ||
     result < 0)
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake file: " << out_oldest
          << " older than: " << dep_newest << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }
  }

  // No need to rerun.
  return 0;
}